

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalWrapper.cpp
# Opt level: O3

Expression * __thiscall IRT::ConditionalWrapper::ToExpression(ConditionalWrapper *this)

{
  int iVar1;
  TempExpression *this_00;
  MoveStatement *this_01;
  ConstExpression *pCVar2;
  SeqStatement *this_02;
  undefined4 extraout_var;
  LabelStatement *this_03;
  MoveStatement *this_04;
  undefined1 local_138 [8];
  Label label_false;
  long local_108 [2];
  Label local_f8;
  Label local_d8;
  long *local_b8 [2];
  long local_a8 [2];
  LabelStatement *local_98;
  EseqExpression *local_90;
  SeqStatement *local_88;
  SeqStatement *local_80;
  SeqStatement *local_78;
  undefined1 local_70 [8];
  Label label_true;
  
  this_00 = (TempExpression *)operator_new(0x28);
  Temporary::Temporary((Temporary *)local_70);
  TempExpression::TempExpression(this_00,(Temporary *)local_70);
  if (local_70 != (undefined1  [8])&label_true.label_._M_string_length) {
    operator_delete((void *)local_70,label_true.label_._M_string_length + 1);
  }
  Label::Label((Label *)local_70);
  Label::Label((Label *)local_138);
  local_90 = (EseqExpression *)operator_new(0x18);
  local_88 = (SeqStatement *)operator_new(0x18);
  this_01 = (MoveStatement *)operator_new(0x18);
  pCVar2 = (ConstExpression *)operator_new(0x10);
  ConstExpression::ConstExpression(pCVar2,1);
  MoveStatement::MoveStatement(this_01,(Expression *)this_00,(Expression *)pCVar2);
  this_02 = (SeqStatement *)operator_new(0x18);
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,local_70,label_true.label_._M_dataplus._M_p + (long)local_70);
  label_false.label_.field_2._8_8_ = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&label_false.label_.field_2 + 8),local_138,
             label_false.label_._M_dataplus._M_p + (long)local_138);
  iVar1 = (*(this->super_SubtreeWrapper)._vptr_SubtreeWrapper[4])
                    (this,local_b8,(undefined1 *)((long)&label_false.label_.field_2 + 8));
  local_80 = (SeqStatement *)operator_new(0x18);
  this_03 = (LabelStatement *)operator_new(0x28);
  local_f8.label_._M_dataplus._M_p = (pointer)&local_f8.label_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_138,label_false.label_._M_dataplus._M_p + (long)local_138);
  local_98 = this_03;
  LabelStatement::LabelStatement(this_03,&local_f8);
  local_78 = (SeqStatement *)operator_new(0x18);
  this_04 = (MoveStatement *)operator_new(0x18);
  pCVar2 = (ConstExpression *)operator_new(0x10);
  ConstExpression::ConstExpression(pCVar2,0);
  MoveStatement::MoveStatement(this_04,(Expression *)this_00,(Expression *)pCVar2);
  label_true.label_.field_2._8_8_ = operator_new(0x28);
  local_d8.label_._M_dataplus._M_p = (pointer)&local_d8.label_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_70,label_true.label_._M_dataplus._M_p + (long)local_70);
  LabelStatement::LabelStatement((LabelStatement *)label_true.label_.field_2._8_8_,&local_d8);
  SeqStatement::SeqStatement
            (local_78,(Statement *)this_04,(Statement *)label_true.label_.field_2._8_8_);
  SeqStatement::SeqStatement(local_80,&local_98->super_Statement,&local_78->super_Statement);
  SeqStatement::SeqStatement
            (this_02,(Statement *)CONCAT44(extraout_var,iVar1),&local_80->super_Statement);
  SeqStatement::SeqStatement(local_88,(Statement *)this_01,(Statement *)this_02);
  EseqExpression::EseqExpression(local_90,&local_88->super_Statement,(Expression *)this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.label_._M_dataplus._M_p != &local_d8.label_.field_2) {
    operator_delete(local_d8.label_._M_dataplus._M_p,
                    local_d8.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.label_._M_dataplus._M_p != &local_f8.label_.field_2) {
    operator_delete(local_f8.label_._M_dataplus._M_p,
                    local_f8.label_.field_2._M_allocated_capacity + 1);
  }
  if ((long *)label_false.label_.field_2._8_8_ != local_108) {
    operator_delete((void *)label_false.label_.field_2._8_8_,local_108[0] + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  if (local_138 != (undefined1  [8])&label_false.label_._M_string_length) {
    operator_delete((void *)local_138,label_false.label_._M_string_length + 1);
  }
  if (local_70 != (undefined1  [8])&label_true.label_._M_string_length) {
    operator_delete((void *)local_70,label_true.label_._M_string_length + 1);
  }
  return &local_90->super_Expression;
}

Assistant:

Expression *IRT::ConditionalWrapper::ToExpression() {
    auto* temp_expression = new TempExpression(Temporary());
    Label label_true;
    Label label_false;
    return new EseqExpression(
      new SeqStatement(
        new MoveStatement(temp_expression, new ConstExpression(1)),
        new SeqStatement(
          ToConditional(label_true, label_false),
          new SeqStatement(
            new LabelStatement(label_false),
            new SeqStatement(
              new MoveStatement(temp_expression, new ConstExpression(0)),
              new LabelStatement(label_true)
            )
          )
        )
      ),
      temp_expression
    );
}